

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O2

void __thiscall calculator::ExpressionParser<__int128>::unexpected(ExpressionParser<__int128> *this)

{
  ostream *poVar1;
  error *this_00;
  string local_1b0;
  ostringstream msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar1 = std::operator<<((ostream *)&msg,"Syntax error: unexpected token \"");
  std::__cxx11::string::substr((ulong)&local_1b0,(ulong)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1b0);
  poVar1 = std::operator<<(poVar1,"\" at index ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::string::~string((string *)&local_1b0);
  this_00 = (error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  error::error(this_00,&this->expr_,&local_1b0);
  __cxa_throw(this_00,&error::typeinfo,error::~error);
}

Assistant:

void unexpected() const
  {
    std::ostringstream msg;
    msg << "Syntax error: unexpected token \""
        << expr_.substr(index_, expr_.size() - index_)
        << "\" at index "
        << index_;
    throw calculator::error(expr_, msg.str());
  }